

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testlist.cpp
# Opt level: O0

void __thiscall Testlist::print(Testlist *this)

{
  int iVar1;
  ExprNode *pEVar2;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> list;
  Testlist *this_local;
  
  list.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  getTestlist((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_28,this);
  local_2c = 0;
  while( true ) {
    iVar1 = numTests(this);
    if (iVar1 <= local_2c) break;
    if (local_2c != 0) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    pEVar2 = at(this,local_2c);
    (**pEVar2->_vptr_ExprNode)();
    local_2c = local_2c + 1;
  }
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::~vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_28);
  return;
}

Assistant:

void Testlist::print() {
    std::vector<ExprNode*>list = getTestlist();
    for(int i = 0; i < numTests();i++){
        if(i != 0)
            std::cout << ", ";
        at(i)->print();
    }
//    for (auto e: _list) {
//        e->print();
//        std::cout << ", ";
//    }
}